

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

double Pa_GetStreamCpuLoad(PaStream *stream)

{
  PaError PVar1;
  PaStream *in_RDI;
  double result;
  PaError error;
  undefined8 local_18;
  
  PVar1 = PaUtil_ValidateStreamPointer(in_RDI);
  if (PVar1 == 0) {
    local_18 = (double)(**(code **)(*(long *)((long)in_RDI + 0x10) + 0x38))(in_RDI);
  }
  else {
    local_18 = 0.0;
  }
  return local_18;
}

Assistant:

double Pa_GetStreamCpuLoad( PaStream* stream )
{
    PaError error = PaUtil_ValidateStreamPointer( stream );
    double result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetStreamCpuLoad" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( error != paNoError )
    {

        result = 0.0;

        PA_LOGAPI(("Pa_GetStreamCpuLoad returned:\n" ));
        PA_LOGAPI(("\tdouble: 0.0 [PaError error: %d ( %s )]\n", error, Pa_GetErrorText( error ) ));

    }
    else
    {
        result = PA_STREAM_INTERFACE(stream)->GetCpuLoad( stream );

        PA_LOGAPI(("Pa_GetStreamCpuLoad returned:\n" ));
        PA_LOGAPI(("\tdouble: %g\n", result ));

    }

    return result;
}